

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall
TempTrackerBase::OrHashTableOfBitVector
          (TempTrackerBase *this,
          HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *toData,
          HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> **fromData,
          bool deleteData)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_class_16_2_64671122 fn;
  bool deleteData_local;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> **fromData_local;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *toData_local;
  TempTrackerBase *this_local;
  
  if (toData == (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x91,"(toData != nullptr)","toData != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (*fromData == (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x92,"(fromData != nullptr)","fromData != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  fn._1_7_ = 0;
  fn.deleteData = deleteData;
  fn.this = this;
  HashTable<BVSparse<Memory::JitArenaAllocator>*,Memory::ArenaAllocator>::
  Or<TempTrackerBase::OrHashTableOfBitVector(HashTable<BVSparse<Memory::JitArenaAllocator>*,Memory::ArenaAllocator>*,HashTable<BVSparse<Memory::JitArenaAllocator>*,Memory::ArenaAllocator>*&,bool)::__0>
            ((HashTable<BVSparse<Memory::JitArenaAllocator>*,Memory::ArenaAllocator> *)toData,
             *fromData,fn);
  if (deleteData) {
    HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Delete(*fromData);
    *fromData = (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0;
  }
  return;
}

Assistant:

void
TempTrackerBase::OrHashTableOfBitVector(HashTable<BVSparse<JitArenaAllocator> *> * toData, HashTable<BVSparse<JitArenaAllocator> *> *& fromData, bool deleteData)
{
    Assert(toData != nullptr);
    Assert(fromData != nullptr);
    toData->Or(fromData,
        [=](BVSparse<JitArenaAllocator> * bv1, BVSparse<JitArenaAllocator> * bv2) -> BVSparse<JitArenaAllocator> *
    {
        if (bv1 == nullptr)
        {
            if (deleteData)
            {
                return bv2;
            }
            return bv2->CopyNew(this->GetAllocator());
        }
        bv1->Or(bv2);
        if (deleteData)
        {
            JitAdelete(this->GetAllocator(), bv2);
        }
        return bv1;
    });

    if (deleteData)
    {
        fromData->Delete();
        fromData = nullptr;
    }
}